

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O3

bool deqp::gles31::Functional::anon_unknown_1::isStencilFormat
               (deUint32 format,DepthStencilMode mode)

{
  bool bVar1;
  TextureFormat TVar2;
  
  if (((4 < format - 0x1906) || (bVar1 = false, (0x19U >> (format - 0x1906 & 0x1f) & 1) == 0)) &&
     (bVar1 = false, format != 0x80e1)) {
    bVar1 = glu::isCompressedFormat(format);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      TVar2 = glu::mapGLInternalFormat(format);
      bVar1 = true;
      if (TVar2.order != S) {
        bVar1 = mode == MODE_STENCIL && TVar2.order == DS;
      }
    }
  }
  return bVar1;
}

Assistant:

bool isStencilFormat (deUint32 format, tcu::Sampler::DepthStencilMode mode)
{
	if (format == GL_LUMINANCE || format == GL_LUMINANCE_ALPHA || format == GL_ALPHA || format == GL_BGRA)
	{
		// Unsized formats are a special case
		return false;
	}
	else if (glu::isCompressedFormat(format))
	{
		// no known compressed stencil formats
		return false;
	}
	else
	{
		const tcu::TextureFormat fmt = glu::mapGLInternalFormat(format);

		if (fmt.order == tcu::TextureFormat::S)
		{
			DE_ASSERT(mode == tcu::Sampler::MODE_STENCIL);
			return true;
		}
		else if (fmt.order == tcu::TextureFormat::DS && mode == tcu::Sampler::MODE_STENCIL)
			return true;
		else
			return false;
	}
}